

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::assignDiffuseColor(XmlSerializer *this,aiMaterial *mat)

{
  XmlReader *pXVar1;
  bool bVar2;
  undefined8 uVar3;
  float extraout_var;
  undefined1 local_30 [8];
  aiColor4D diffuse;
  char *color;
  aiMaterial *mat_local;
  XmlSerializer *this_local;
  
  pXVar1 = this->xmlReader;
  uVar3 = std::__cxx11::string::c_str();
  diffuse.b = (float)(*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar3);
  diffuse.a = extraout_var;
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_30);
  bVar2 = parseColor(this,(char *)diffuse._8_8_,(aiColor4D *)local_30);
  if (bVar2) {
    aiMaterial::AddProperty<aiColor4t<float>>(mat,(aiColor4D *)local_30,1,"$clr.diffuse",0,0);
  }
  return;
}

Assistant:

void assignDiffuseColor( aiMaterial *mat ) {
        const char *color = xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_displaycolor.c_str() );
        aiColor4D diffuse;
        if ( parseColor( color, diffuse ) ) {
            mat->AddProperty<aiColor4D>( &diffuse, 1, AI_MATKEY_COLOR_DIFFUSE );
        }

    }